

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

UInt32 ReadMatchDistances(CLzmaEnc *p,UInt32 *numDistancePairsRes)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  int *in_RSI;
  undefined8 *in_RDI;
  bool bVar4;
  Byte *pbyLim;
  ptrdiff_t dif;
  Byte *pby;
  Byte *pbyCur;
  UInt32 numAvail;
  UInt32 numPairs;
  UInt32 lenRes;
  char *local_30;
  uint local_1c;
  uint local_14;
  
  local_14 = 0;
  uVar1 = (*(code *)in_RDI[2])(*in_RDI);
  *(undefined4 *)(in_RDI + 8) = uVar1;
  iVar2 = (*(code *)in_RDI[4])(*in_RDI,in_RDI + 0x64f0);
  if ((iVar2 != 0) &&
     (local_14 = *(uint *)((long)in_RDI + (ulong)(iVar2 - 2) * 4 + 0x32780),
     local_14 == *(uint *)((long)in_RDI + 0x44))) {
    local_1c = *(uint *)(in_RDI + 8);
    if (0x111 < local_1c) {
      local_1c = 0x111;
    }
    lVar3 = (*(code *)in_RDI[3])(*in_RDI);
    lVar3 = lVar3 + -1;
    local_30 = (char *)(lVar3 + (ulong)local_14);
    while( true ) {
      bVar4 = false;
      if (local_30 != (char *)(lVar3 + (ulong)local_1c)) {
        bVar4 = *local_30 ==
                local_30[-1 - (ulong)*(uint *)((long)in_RDI + (ulong)(iVar2 - 1) * 4 + 0x32780)];
      }
      if (!bVar4) break;
      local_30 = local_30 + 1;
    }
    local_14 = (int)local_30 - (int)lVar3;
  }
  *(int *)(in_RDI + 9) = *(int *)(in_RDI + 9) + 1;
  *in_RSI = iVar2;
  return local_14;
}

Assistant:

static UInt32 ReadMatchDistances(CLzmaEnc *p, UInt32 *numDistancePairsRes)
{
  UInt32 lenRes = 0, numPairs;
  p->numAvail = p->matchFinder.GetNumAvailableBytes(p->matchFinderObj);
  numPairs = p->matchFinder.GetMatches(p->matchFinderObj, p->matches);
  
  #ifdef SHOW_STAT
  printf("\n i = %u numPairs = %u    ", g_STAT_OFFSET, numPairs / 2);
  g_STAT_OFFSET++;
  {
    UInt32 i;
    for (i = 0; i < numPairs; i += 2)
      printf("%2u %6u   | ", p->matches[i], p->matches[i + 1]);
  }
  #endif
  
  if (numPairs > 0)
  {
    lenRes = p->matches[numPairs - 2];
    if (lenRes == p->numFastBytes)
    {
      UInt32 numAvail = p->numAvail;
      if (numAvail > LZMA_MATCH_LEN_MAX)
        numAvail = LZMA_MATCH_LEN_MAX;
      {
        const Byte *pbyCur = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - 1;
        const Byte *pby = pbyCur + lenRes;
        ptrdiff_t dif = (ptrdiff_t)-1 - p->matches[numPairs - 1];
        const Byte *pbyLim = pbyCur + numAvail;
        for (; pby != pbyLim && *pby == pby[dif]; pby++);
        lenRes = (UInt32)(pby - pbyCur);
      }
    }
  }
  p->additionalOffset++;
  *numDistancePairsRes = numPairs;
  return lenRes;
}